

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwebp.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  VP8StatusCode format_00;
  WebPDecoderConfig *config_00;
  uint8_t *puVar4;
  long in_RSI;
  int in_EDI;
  char *pcVar5;
  double dVar6;
  double decode_time;
  Stopwatch stop_watch;
  size_t data_size;
  VP8StatusCode status;
  char *fmt;
  int version;
  int parse_error;
  int c;
  int incremental;
  uint8_t *data;
  int use_external_memory;
  uint8_t *external_buffer;
  WebPOutputFileFormat format;
  WebPBitstreamFeatures *bitstream;
  WebPDecBuffer *output_buffer;
  WebPDecoderConfig config;
  char *out_file;
  char *in_file;
  int ok;
  undefined8 in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  WebPDecoderConfig *in_stack_fffffffffffffe78;
  Stopwatch *in_stack_fffffffffffffe80;
  uint8_t *in_stack_fffffffffffffe88;
  char *pcVar7;
  uint in_stack_fffffffffffffe98;
  WebPDecBuffer *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  WebPOutputFileFormat format_01;
  WebPDecoderConfig *config_01;
  uint local_13c;
  uint local_12c;
  int local_110;
  int local_108;
  uint local_ec;
  uint local_e8;
  long local_28;
  long local_20;
  uint local_14;
  
  local_14 = 0;
  local_20 = 0;
  local_28 = 0;
  local_12c = 0;
  local_13c = 0;
  config_01 = (WebPDecoderConfig *)0x0;
  format_01 = PNG;
  iVar1 = WebPInitDecoderConfig((WebPDecoderConfig *)0x102619);
  if (iVar1 == 0) {
    fprintf(stderr,"Library version mismatch!\n");
    return 1;
  }
  for (iVar1 = 1; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    in_stack_fffffffffffffeac = 0;
    iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-h");
    if ((iVar2 == 0) || (iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-help"), iVar2 == 0))
    {
      Help();
      return 0;
    }
    iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-o");
    if ((iVar2 == 0) && (iVar1 < in_EDI + -1)) {
      iVar1 = iVar1 + 1;
      local_28 = *(long *)(in_RSI + (long)iVar1 * 8);
    }
    else {
      iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-alpha");
      if (iVar2 == 0) {
        local_12c = 7;
      }
      else {
        iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-nofancy");
        if ((iVar2 != 0) &&
           (iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-nofilter"), iVar2 != 0)) {
          iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-pam");
          if (iVar2 == 0) {
            local_12c = 1;
          }
          else {
            iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-ppm");
            if (iVar2 == 0) {
              local_12c = 2;
            }
            else {
              iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-bmp");
              if (iVar2 == 0) {
                local_12c = 4;
              }
              else {
                iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-tiff");
                if (iVar2 == 0) {
                  local_12c = 5;
                }
                else {
                  iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-quiet");
                  if (iVar2 == 0) {
                    quiet = 1;
                  }
                  else {
                    iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-version");
                    if (iVar2 == 0) {
                      uVar3 = WebPGetDecoderVersion();
                      printf("%d.%d.%d\n",(ulong)((int)uVar3 >> 0x10 & 0xff),
                             (ulong)((int)uVar3 >> 8 & 0xff),(ulong)(uVar3 & 0xff));
                      return 0;
                    }
                    iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-pgm");
                    if (iVar2 == 0) {
                      local_12c = 3;
                    }
                    else {
                      iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-yuv");
                      if (iVar2 == 0) {
                        local_12c = 6;
                      }
                      else {
                        iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-pixel_format");
                        if ((iVar2 == 0) && (iVar1 < in_EDI + -1)) {
                          iVar1 = iVar1 + 1;
                          in_stack_fffffffffffffea0 = *(WebPDecBuffer **)(in_RSI + (long)iVar1 * 8);
                          iVar2 = strcmp((char *)in_stack_fffffffffffffea0,"RGB");
                          if (iVar2 == 0) {
                            local_12c = 8;
                          }
                          else {
                            iVar2 = strcmp((char *)in_stack_fffffffffffffea0,"RGBA");
                            if (iVar2 == 0) {
                              local_12c = 9;
                            }
                            else {
                              iVar2 = strcmp((char *)in_stack_fffffffffffffea0,"BGR");
                              if (iVar2 == 0) {
                                local_12c = 10;
                              }
                              else {
                                iVar2 = strcmp((char *)in_stack_fffffffffffffea0,"BGRA");
                                if (iVar2 == 0) {
                                  local_12c = 0xb;
                                }
                                else {
                                  iVar2 = strcmp((char *)in_stack_fffffffffffffea0,"ARGB");
                                  if (iVar2 == 0) {
                                    local_12c = 0xc;
                                  }
                                  else {
                                    iVar2 = strcmp((char *)in_stack_fffffffffffffea0,"RGBA_4444");
                                    if (iVar2 == 0) {
                                      local_12c = 0xd;
                                    }
                                    else {
                                      iVar2 = strcmp((char *)in_stack_fffffffffffffea0,"RGB_565");
                                      if (iVar2 == 0) {
                                        local_12c = 0xe;
                                      }
                                      else {
                                        iVar2 = strcmp((char *)in_stack_fffffffffffffea0,"rgbA");
                                        if (iVar2 == 0) {
                                          local_12c = 0xf;
                                        }
                                        else {
                                          iVar2 = strcmp((char *)in_stack_fffffffffffffea0,"bgrA");
                                          if (iVar2 == 0) {
                                            local_12c = 0x10;
                                          }
                                          else {
                                            iVar2 = strcmp((char *)in_stack_fffffffffffffea0,"Argb")
                                            ;
                                            if (iVar2 == 0) {
                                              local_12c = 0x11;
                                            }
                                            else {
                                              iVar2 = strcmp((char *)in_stack_fffffffffffffea0,
                                                             "rgbA_4444");
                                              if (iVar2 == 0) {
                                                local_12c = 0x12;
                                              }
                                              else {
                                                iVar2 = strcmp((char *)in_stack_fffffffffffffea0,
                                                               "YUV");
                                                if (iVar2 == 0) {
                                                  local_12c = 0x13;
                                                }
                                                else {
                                                  iVar2 = strcmp((char *)in_stack_fffffffffffffea0,
                                                                 "YUVA");
                                                  if (iVar2 == 0) {
                                                    local_12c = 0x14;
                                                  }
                                                  else {
                                                    fprintf(stderr,"Can\'t parse pixel_format %s\n",
                                                            in_stack_fffffffffffffea0);
                                                    in_stack_fffffffffffffeac = 1;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        else {
                          iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-external_memory");
                          if ((iVar2 == 0) && (iVar1 < in_EDI + -1)) {
                            iVar1 = iVar1 + 1;
                            local_13c = ExUtilGetInt((char *)CONCAT17(in_stack_fffffffffffffe77,
                                                                      in_stack_fffffffffffffe70),
                                                     (int)((ulong)in_stack_fffffffffffffe68 >> 0x20)
                                                     ,(int *)0x102c23);
                            in_stack_fffffffffffffe77 = 2 < local_13c;
                            in_stack_fffffffffffffeac =
                                 (byte)in_stack_fffffffffffffe77 | in_stack_fffffffffffffeac;
                            if (in_stack_fffffffffffffeac != 0) {
                              fprintf(stderr,"Can\'t parse \'external_memory\' value %s\n",
                                      *(undefined8 *)(in_RSI + (long)iVar1 * 8));
                            }
                          }
                          else {
                            iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-mt");
                            if (((iVar2 != 0) &&
                                (iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-alpha_dither"
                                               ), iVar2 != 0)) &&
                               (iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-nodither"),
                               iVar2 != 0)) {
                              iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-dither");
                              if ((iVar2 == 0) && (iVar1 < in_EDI + -1)) {
                                iVar1 = iVar1 + 1;
                                ExUtilGetInt((char *)CONCAT17(in_stack_fffffffffffffe77,
                                                              in_stack_fffffffffffffe70),
                                             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                             (int *)0x102d76);
                              }
                              else {
                                iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-crop");
                                if ((iVar2 == 0) && (iVar1 < in_EDI + -4)) {
                                  iVar1 = iVar1 + 1;
                                  ExUtilGetInt((char *)CONCAT17(in_stack_fffffffffffffe77,
                                                                in_stack_fffffffffffffe70),
                                               (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                               (int *)0x102def);
                                  iVar1 = iVar1 + 1;
                                  ExUtilGetInt((char *)CONCAT17(in_stack_fffffffffffffe77,
                                                                in_stack_fffffffffffffe70),
                                               (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                               (int *)0x102e1c);
                                  iVar1 = iVar1 + 1;
                                  ExUtilGetInt((char *)CONCAT17(in_stack_fffffffffffffe77,
                                                                in_stack_fffffffffffffe70),
                                               (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                               (int *)0x102e49);
                                  iVar1 = iVar1 + 1;
                                  ExUtilGetInt((char *)CONCAT17(in_stack_fffffffffffffe77,
                                                                in_stack_fffffffffffffe70),
                                               (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                               (int *)0x102e76);
                                }
                                else {
                                  iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-scale");
                                  if (((iVar2 == 0) ||
                                      (iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-resize"
                                                     ), iVar2 == 0)) && (iVar1 < in_EDI + -2)) {
                                    iVar1 = iVar1 + 1;
                                    ExUtilGetInt((char *)CONCAT17(in_stack_fffffffffffffe77,
                                                                  in_stack_fffffffffffffe70),
                                                 (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                                 (int *)0x102f09);
                                    iVar1 = iVar1 + 1;
                                    ExUtilGetInt((char *)CONCAT17(in_stack_fffffffffffffe77,
                                                                  in_stack_fffffffffffffe70),
                                                 (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                                                 (int *)0x102f36);
                                  }
                                  else {
                                    iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-flip");
                                    if (iVar2 != 0) {
                                      iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-v");
                                      if (iVar2 == 0) {
                                        verbose = 1;
                                      }
                                      else {
                                        iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"-noasm"
                                                      );
                                        if (iVar2 == 0) {
                                          VP8GetCPUInfo = (VP8CPUInfo)0x0;
                                        }
                                        else {
                                          iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),
                                                         "-incremental");
                                          if (iVar2 == 0) {
                                            format_01 = PAM;
                                          }
                                          else {
                                            iVar2 = strcmp(*(char **)(in_RSI + (long)iVar1 * 8),"--"
                                                          );
                                            if (iVar2 == 0) {
                                              if (iVar1 < in_EDI + -1) {
                                                iVar1 = iVar1 + 1;
                                                local_20 = *(long *)(in_RSI + (long)iVar1 * 8);
                                              }
                                              break;
                                            }
                                            if (**(char **)(in_RSI + (long)iVar1 * 8) == '-') {
                                              fprintf(stderr,"Unknown option \'%s\'\n",
                                                      *(undefined8 *)(in_RSI + (long)iVar1 * 8));
                                              Help();
                                              return 1;
                                            }
                                            local_20 = *(long *)(in_RSI + (long)iVar1 * 8);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (in_stack_fffffffffffffeac != 0) {
      Help();
      return 1;
    }
    in_stack_fffffffffffffeac = 0;
  }
  if (local_20 == 0) {
    fprintf(stderr,"missing input file!!\n");
    Help();
    return 1;
  }
  if (quiet != 0) {
    verbose = 0;
  }
  pcVar7 = (char *)0x0;
  iVar2 = LoadWebP((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (uint8_t **)in_stack_fffffffffffffea0,(size_t *)(ulong)in_stack_fffffffffffffe98,
                   (WebPBitstreamFeatures *)0x0);
  if (iVar2 == 0) {
    return 1;
  }
  config_00 = (WebPDecoderConfig *)(ulong)local_12c;
  switch(config_00) {
  case (WebPDecoderConfig *)0x0:
    break;
  case (WebPDecoderConfig *)0x1:
    break;
  case (WebPDecoderConfig *)0x2:
    break;
  case (WebPDecoderConfig *)0x3:
  case (WebPDecoderConfig *)0x6:
    break;
  case (WebPDecoderConfig *)0x4:
    break;
  case (WebPDecoderConfig *)0x5:
    break;
  case (WebPDecoderConfig *)0x7:
    break;
  case (WebPDecoderConfig *)0x8:
    break;
  case (WebPDecoderConfig *)0x9:
    break;
  case (WebPDecoderConfig *)0xa:
    break;
  case (WebPDecoderConfig *)0xb:
    break;
  case (WebPDecoderConfig *)0xc:
    break;
  case (WebPDecoderConfig *)0xd:
    break;
  case (WebPDecoderConfig *)0xe:
    break;
  case (WebPDecoderConfig *)0xf:
    break;
  case (WebPDecoderConfig *)0x10:
    break;
  case (WebPDecoderConfig *)0x11:
    break;
  case (WebPDecoderConfig *)0x12:
    break;
  case (WebPDecoderConfig *)0x13:
    break;
  case (WebPDecoderConfig *)0x14:
    break;
  default:
    goto switchD_001031e9_default;
  }
  if ((((int)local_13c < 1) || (local_12c < 8)) ||
     (puVar4 = AllocateExternalBuffer(config_01,format_01,iVar1), puVar4 != (uint8_t *)0x0)) {
    if (verbose != 0) {
      StopwatchReset((Stopwatch *)0x1033a6);
    }
    if (format_01 == PNG) {
      format_00 = DecodeWebP((uint8_t *)in_stack_fffffffffffffe78,
                             CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),config_00
                            );
      iVar1 = (int)((ulong)config_00 >> 0x20);
    }
    else {
      format_00 = DecodeWebPIncremental
                            (in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80,
                             in_stack_fffffffffffffe78);
      iVar1 = (int)((ulong)config_00 >> 0x20);
    }
    if (verbose != 0) {
      dVar6 = StopwatchReadAndReset(in_stack_fffffffffffffe80);
      fprintf(stderr,"Time to decode picture: %.3fs\n",dVar6);
    }
    local_14 = (uint)(format_00 == VP8_STATUS_OK);
    if (local_14 == 0) {
      PrintWebPError((char *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),iVar1);
    }
    else if (local_28 == 0) {
      if (quiet == 0) {
        fprintf(stderr,"File %s can be decoded ",local_20);
        pcVar7 = "";
        if (local_110 != 0) {
          pcVar7 = " (with alpha)";
        }
        fprintf(stderr,"(dimensions: %d x %d %s. Format: %s).\n",(ulong)local_ec,(ulong)local_e8,
                pcVar7,kFormatType[local_108]);
        fprintf(stderr,"Nothing written; use -o flag to save the result as e.g. PNG.\n");
      }
    }
    else {
      if (quiet == 0) {
        fprintf(stderr,"Decoded %s.",local_20);
        pcVar5 = "";
        if (local_110 != 0) {
          pcVar5 = " (with alpha)";
        }
        fprintf(stderr," Dimensions: %d x %d %s. Format: %s. Now saving...\n",(ulong)local_ec,
                (ulong)local_e8,pcVar5,kFormatType[local_108]);
      }
      local_14 = SaveOutput(in_stack_fffffffffffffea0,format_00,pcVar7);
    }
  }
switchD_001031e9_default:
  WebPFreeDecBuffer((WebPDecBuffer *)0x1035af);
  WebPFree((void *)0x1035b9);
  WebPFree((void *)0x1035c3);
  return (uint)(local_14 == 0);
}

Assistant:

int main(int argc, const char* argv[]) {
  int ok = 0;
  const char* in_file = NULL;
  const char* out_file = NULL;

  WebPDecoderConfig config;
  WebPDecBuffer* const output_buffer = &config.output;
  WebPBitstreamFeatures* const bitstream = &config.input;
  WebPOutputFileFormat format = PNG;
  uint8_t* external_buffer = NULL;
  int use_external_memory = 0;
  const uint8_t* data = NULL;

  int incremental = 0;
  int c;

  INIT_WARGV(argc, argv);

  if (!WebPInitDecoderConfig(&config)) {
    fprintf(stderr, "Library version mismatch!\n");
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  for (c = 1; c < argc; ++c) {
    int parse_error = 0;
    if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help")) {
      Help();
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else if (!strcmp(argv[c], "-o") && c < argc - 1) {
      out_file = (const char*)GET_WARGV(argv, ++c);
    } else if (!strcmp(argv[c], "-alpha")) {
      format = ALPHA_PLANE_ONLY;
    } else if (!strcmp(argv[c], "-nofancy")) {
      config.options.no_fancy_upsampling = 1;
    } else if (!strcmp(argv[c], "-nofilter")) {
      config.options.bypass_filtering = 1;
    } else if (!strcmp(argv[c], "-pam")) {
      format = PAM;
    } else if (!strcmp(argv[c], "-ppm")) {
      format = PPM;
    } else if (!strcmp(argv[c], "-bmp")) {
      format = BMP;
    } else if (!strcmp(argv[c], "-tiff")) {
      format = TIFF;
    } else if (!strcmp(argv[c], "-quiet")) {
      quiet = 1;
    } else if (!strcmp(argv[c], "-version")) {
      const int version = WebPGetDecoderVersion();
      printf("%d.%d.%d\n",
             (version >> 16) & 0xff, (version >> 8) & 0xff, version & 0xff);
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else if (!strcmp(argv[c], "-pgm")) {
      format = PGM;
    } else if (!strcmp(argv[c], "-yuv")) {
      format = RAW_YUV;
    } else if (!strcmp(argv[c], "-pixel_format") && c < argc - 1) {
      const char* const fmt = argv[++c];
      if      (!strcmp(fmt, "RGB"))  format = RGB;
      else if (!strcmp(fmt, "RGBA")) format = RGBA;
      else if (!strcmp(fmt, "BGR"))  format = BGR;
      else if (!strcmp(fmt, "BGRA")) format = BGRA;
      else if (!strcmp(fmt, "ARGB")) format = ARGB;
      else if (!strcmp(fmt, "RGBA_4444")) format = RGBA_4444;
      else if (!strcmp(fmt, "RGB_565")) format = RGB_565;
      else if (!strcmp(fmt, "rgbA")) format = rgbA;
      else if (!strcmp(fmt, "bgrA")) format = bgrA;
      else if (!strcmp(fmt, "Argb")) format = Argb;
      else if (!strcmp(fmt, "rgbA_4444")) format = rgbA_4444;
      else if (!strcmp(fmt, "YUV"))  format = YUV;
      else if (!strcmp(fmt, "YUVA")) format = YUVA;
      else {
        fprintf(stderr, "Can't parse pixel_format %s\n", fmt);
        parse_error = 1;
      }
    } else if (!strcmp(argv[c], "-external_memory") && c < argc - 1) {
      use_external_memory = ExUtilGetInt(argv[++c], 0, &parse_error);
      parse_error |= (use_external_memory > 2 || use_external_memory < 0);
      if (parse_error) {
        fprintf(stderr, "Can't parse 'external_memory' value %s\n", argv[c]);
      }
    } else if (!strcmp(argv[c], "-mt")) {
      config.options.use_threads = 1;
    } else if (!strcmp(argv[c], "-alpha_dither")) {
      config.options.alpha_dithering_strength = 100;
    } else if (!strcmp(argv[c], "-nodither")) {
      config.options.dithering_strength = 0;
    } else if (!strcmp(argv[c], "-dither") && c < argc - 1) {
      config.options.dithering_strength =
          ExUtilGetInt(argv[++c], 0, &parse_error);
    } else if (!strcmp(argv[c], "-crop") && c < argc - 4) {
      config.options.use_cropping = 1;
      config.options.crop_left   = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.crop_top    = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.crop_width  = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.crop_height = ExUtilGetInt(argv[++c], 0, &parse_error);
    } else if ((!strcmp(argv[c], "-scale") || !strcmp(argv[c], "-resize")) &&
               c < argc - 2) {  // '-scale' is left for compatibility
      config.options.use_scaling = 1;
      config.options.scaled_width  = ExUtilGetInt(argv[++c], 0, &parse_error);
      config.options.scaled_height = ExUtilGetInt(argv[++c], 0, &parse_error);
    } else if (!strcmp(argv[c], "-flip")) {
      config.options.flip = 1;
    } else if (!strcmp(argv[c], "-v")) {
      verbose = 1;
#ifndef WEBP_DLL
    } else if (!strcmp(argv[c], "-noasm")) {
      VP8GetCPUInfo = NULL;
#endif
    } else if (!strcmp(argv[c], "-incremental")) {
      incremental = 1;
    } else if (!strcmp(argv[c], "--")) {
      if (c < argc - 1) in_file = (const char*)GET_WARGV(argv, ++c);
      break;
    } else if (argv[c][0] == '-') {
      fprintf(stderr, "Unknown option '%s'\n", argv[c]);
      Help();
      FREE_WARGV_AND_RETURN(EXIT_FAILURE);
    } else {
      in_file = (const char*)GET_WARGV(argv, c);
    }

    if (parse_error) {
      Help();
      FREE_WARGV_AND_RETURN(EXIT_FAILURE);
    }
  }

  if (in_file == NULL) {
    fprintf(stderr, "missing input file!!\n");
    Help();
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  if (quiet) verbose = 0;

  {
    VP8StatusCode status = VP8_STATUS_OK;
    size_t data_size = 0;
    if (!LoadWebP(in_file, &data, &data_size, bitstream)) {
      FREE_WARGV_AND_RETURN(EXIT_FAILURE);
    }

    switch (format) {
      case PNG:
#ifdef HAVE_WINCODEC_H
        output_buffer->colorspace = bitstream->has_alpha ? MODE_BGRA : MODE_BGR;
#else
        output_buffer->colorspace = bitstream->has_alpha ? MODE_RGBA : MODE_RGB;
#endif
        break;
      case PAM:
        output_buffer->colorspace = MODE_RGBA;
        break;
      case PPM:
        output_buffer->colorspace = MODE_RGB;  // drops alpha for PPM
        break;
      case BMP:
        output_buffer->colorspace = bitstream->has_alpha ? MODE_BGRA : MODE_BGR;
        break;
      case TIFF:
        output_buffer->colorspace = bitstream->has_alpha ? MODE_RGBA : MODE_RGB;
        break;
      case PGM:
      case RAW_YUV:
        output_buffer->colorspace = bitstream->has_alpha ? MODE_YUVA : MODE_YUV;
        break;
      case ALPHA_PLANE_ONLY:
        output_buffer->colorspace = MODE_YUVA;
        break;
      // forced modes:
      case RGB: output_buffer->colorspace = MODE_RGB; break;
      case RGBA: output_buffer->colorspace = MODE_RGBA; break;
      case BGR: output_buffer->colorspace = MODE_BGR; break;
      case BGRA: output_buffer->colorspace = MODE_BGRA; break;
      case ARGB: output_buffer->colorspace = MODE_ARGB; break;
      case RGBA_4444: output_buffer->colorspace = MODE_RGBA_4444; break;
      case RGB_565: output_buffer->colorspace = MODE_RGB_565; break;
      case rgbA: output_buffer->colorspace = MODE_rgbA; break;
      case bgrA: output_buffer->colorspace = MODE_bgrA; break;
      case Argb: output_buffer->colorspace = MODE_Argb; break;
      case rgbA_4444: output_buffer->colorspace = MODE_rgbA_4444; break;
      case YUV: output_buffer->colorspace = MODE_YUV; break;
      case YUVA: output_buffer->colorspace = MODE_YUVA; break;
      default: goto Exit;
    }

    if (use_external_memory > 0 && format >= RGB) {
      external_buffer = AllocateExternalBuffer(&config, format,
                                               use_external_memory);
      if (external_buffer == NULL) goto Exit;
    }

    {
      Stopwatch stop_watch;
      if (verbose) StopwatchReset(&stop_watch);

      if (incremental) {
        status = DecodeWebPIncremental(data, data_size, &config);
      } else {
        status = DecodeWebP(data, data_size, &config);
      }
      if (verbose) {
        const double decode_time = StopwatchReadAndReset(&stop_watch);
        fprintf(stderr, "Time to decode picture: %.3fs\n", decode_time);
      }
    }

    ok = (status == VP8_STATUS_OK);
    if (!ok) {
      PrintWebPError(in_file, status);
      goto Exit;
    }
  }

  if (out_file != NULL) {
    if (!quiet) {
      WFPRINTF(stderr, "Decoded %s.", (const W_CHAR*)in_file);
      fprintf(stderr, " Dimensions: %d x %d %s. Format: %s. Now saving...\n",
              output_buffer->width, output_buffer->height,
              bitstream->has_alpha ? " (with alpha)" : "",
              kFormatType[bitstream->format]);
    }
    ok = SaveOutput(output_buffer, format, out_file);
  } else {
    if (!quiet) {
      WFPRINTF(stderr, "File %s can be decoded ", (const W_CHAR*)in_file);
      fprintf(stderr, "(dimensions: %d x %d %s. Format: %s).\n",
              output_buffer->width, output_buffer->height,
              bitstream->has_alpha ? " (with alpha)" : "",
              kFormatType[bitstream->format]);
      fprintf(stderr, "Nothing written; "
                      "use -o flag to save the result as e.g. PNG.\n");
    }
  }
 Exit:
  WebPFreeDecBuffer(output_buffer);
  WebPFree((void*)external_buffer);
  WebPFree((void*)data);
  FREE_WARGV_AND_RETURN(ok ? EXIT_SUCCESS : EXIT_FAILURE);
}